

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

bool __thiscall
QScroller::handleInput(QScroller *this,Input input,QPointF *position,qint64 timestamp)

{
  char *pcVar1;
  QScrollerPrivate *pQVar2;
  bool bVar3;
  QDebug QVar4;
  qreal this_00;
  undefined1 uVar5;
  code *pcVar6;
  char *pcVar7;
  storage_type *psVar8;
  long lVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 uStack_78;
  undefined4 local_74;
  char *local_70;
  QDebug local_68;
  QPointF local_60;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = this->d_ptr;
  lcScroller();
  uVar5 = lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i;
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_88._0_4_ = 2;
    local_88._4_4_ = 0;
    uStack_80._0_4_ = 0;
    uStack_80._4_4_ = 0;
    uStack_78 = 0;
    local_74 = 0;
    local_70 = lcScroller::category.name;
    QMessageLogger::debug();
    QVar4.stream = local_68.stream;
    QVar10.m_data = (storage_type *)0x17;
    QVar10.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_68.stream,input);
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    QVar4.stream = local_68.stream;
    QVar11.m_data = (storage_type *)0x2;
    QVar11.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    QVar4.stream = local_68.stream;
    if ((ulong)pQVar2->state < 4) {
      pcVar7 = *(char **)(&DAT_00823cd8 + (ulong)pQVar2->state * 8);
    }
    else {
      pcVar7 = "(invalid)";
    }
    psVar8 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar8 + (long)(pcVar7 + 1);
      psVar8 = psVar8 + 1;
    } while (*pcVar1 != '\0');
    QVar12.m_data = psVar8;
    QVar12.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    QVar4.stream = local_68.stream;
    QVar13.m_data = (storage_type *)0x2;
    QVar13.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    local_60.xp = (qreal)local_68.stream;
    *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
    ::operator<<((QDebug)&local_60.yp,&local_60);
    this_00 = local_60.yp;
    QVar14.m_data = (storage_type *)0x2;
    QVar14.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)this_00,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_60.yp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.yp,' ');
    }
    QTextStream::operator<<((QTextStream *)local_60.yp,timestamp);
    if (*(QTextStream *)((long)local_60.yp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.yp,' ');
    }
    QTextStream::operator<<((QTextStream *)local_60.yp,')');
    if (*(QTextStream *)((long)local_60.yp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.yp,' ');
    }
    QDebug::~QDebug((QDebug *)&local_60.yp);
    QDebug::~QDebug((QDebug *)&local_60);
    uVar5 = QDebug::~QDebug(&local_68);
  }
  lVar9 = 0x10;
  do {
    bVar3 = true;
    if ((pQVar2->state == *(State *)((long)&PTR_connectNotify_00823ac0 + lVar9)) &&
       (*(Input *)((long)&PTR_connectNotify_00823ac0 + lVar9 + 4) == input)) {
      pcVar6 = *(code **)((long)&PTR_disconnectNotify_00823ac8 + lVar9);
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *(long *)(&pQVar2->super_QObject +
                                              *(long *)((long)&DAT_00823ad0 + lVar9)) + -1);
      }
      local_88 = position->xp - (pQVar2->overshootPosition).xp;
      uStack_80 = position->yp - (pQVar2->overshootPosition).yp;
      uVar5 = (*pcVar6)(&pQVar2->super_QObject + *(long *)((long)&DAT_00823ad0 + lVar9),&local_88,
                        timestamp);
      bVar3 = false;
    }
    if (!bVar3) goto LAB_00664609;
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0xa0);
  uVar5 = 0;
LAB_00664609:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(uVar5 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QScroller::handleInput(Input input, const QPointF &position, qint64 timestamp)
{
    Q_D(QScroller);

    qCDebug(lcScroller) << "QScroller::handleInput(" << input << ", " << d->stateName(d->state)
                        << ", " << position << ", " << timestamp << ')';
    struct statechange {
        State state;
        Input input;
        typedef bool (QScrollerPrivate::*inputhandler_t)(const QPointF &position, qint64 timestamp);
        inputhandler_t handler;
    };

    statechange statechanges[] = {
        { QScroller::Inactive,  InputPress,   &QScrollerPrivate::pressWhileInactive },
        { QScroller::Pressed,   InputMove,    &QScrollerPrivate::moveWhilePressed },
        { QScroller::Pressed,   InputRelease, &QScrollerPrivate::releaseWhilePressed },
        { QScroller::Dragging,  InputMove,    &QScrollerPrivate::moveWhileDragging },
        { QScroller::Dragging,  InputRelease, &QScrollerPrivate::releaseWhileDragging },
        { QScroller::Scrolling, InputPress,   &QScrollerPrivate::pressWhileScrolling }
    };

    for (int i = 0; i < int(sizeof(statechanges) / sizeof(*statechanges)); ++i) {
        statechange *sc = statechanges + i;

         if (d->state == sc->state && input == sc->input)
             return (d->*sc->handler)(position - d->overshootPosition, timestamp);
    }
    return false;
}